

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlCtxtReset(xmlParserCtxtPtr ctxt)

{
  xmlDictPtr dict;
  int *piVar1;
  int iVar2;
  xmlParserInputPtr input;
  xmlChar *pxVar3;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  dict = ctxt->dict;
  while (input = inputPop(ctxt), input != (xmlParserInputPtr)0x0) {
    xmlFreeInputStream(input);
  }
  ctxt->inputNr = 0;
  ctxt->input = (xmlParserInputPtr)0x0;
  ctxt->spaceNr = 0;
  piVar1 = ctxt->spaceTab;
  if (piVar1 != (int *)0x0) {
    *piVar1 = -1;
  }
  ctxt->space = piVar1;
  ctxt->nodeNr = 0;
  ctxt->node = (xmlNodePtr)0x0;
  ctxt->nameNr = 0;
  ctxt->name = (xmlChar *)0x0;
  pxVar3 = ctxt->version;
  if (pxVar3 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_001688b4;
      pxVar3 = ctxt->version;
    }
    (*xmlFree)(pxVar3);
  }
LAB_001688b4:
  ctxt->version = (xmlChar *)0x0;
  pxVar3 = ctxt->encoding;
  if (pxVar3 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_001688e3;
      pxVar3 = ctxt->encoding;
    }
    (*xmlFree)(pxVar3);
  }
LAB_001688e3:
  ctxt->encoding = (xmlChar *)0x0;
  pxVar3 = (xmlChar *)ctxt->directory;
  if (pxVar3 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_00168918;
      pxVar3 = (xmlChar *)ctxt->directory;
    }
    (*xmlFree)(pxVar3);
  }
LAB_00168918:
  ctxt->directory = (char *)0x0;
  pxVar3 = ctxt->extSubURI;
  if (pxVar3 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_00168950;
      pxVar3 = ctxt->extSubURI;
    }
    (*xmlFree)(pxVar3);
  }
LAB_00168950:
  ctxt->extSubURI = (xmlChar *)0x0;
  pxVar3 = ctxt->extSubSystem;
  if (pxVar3 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar2 = xmlDictOwns(dict,pxVar3);
      if (iVar2 != 0) goto LAB_00168988;
      pxVar3 = ctxt->extSubSystem;
    }
    (*xmlFree)(pxVar3);
  }
LAB_00168988:
  ctxt->extSubSystem = (xmlChar *)0x0;
  if (ctxt->myDoc != (xmlDocPtr)0x0) {
    xmlFreeDoc(ctxt->myDoc);
  }
  ctxt->myDoc = (xmlDocPtr)0x0;
  ctxt->standalone = -1;
  ctxt->html = 0;
  ctxt->instate = XML_PARSER_START;
  ctxt->token = 0;
  ctxt->wellFormed = 1;
  ctxt->nsWellFormed = 1;
  ctxt->disableSAX = 0;
  ctxt->inSubset = 0;
  ctxt->hasExternalSubset = 0;
  ctxt->hasPErefs = 0;
  ctxt->external = 0;
  ctxt->valid = 1;
  ctxt->record_info = 0;
  ctxt->checkIndex = 0;
  ctxt->errNo = 0;
  ctxt->depth = 0;
  ctxt->charset = 1;
  ctxt->catalogs = (void *)0x0;
  ctxt->nbentities = 0;
  ctxt->sizeentities = 0;
  ctxt->sizeentcopy = 0;
  ctxt->mlType = XML_TYPE_UNKNOWN;
  ctxt->curly = 0;
  xmlInitNodeInfoSeq(&ctxt->node_seq);
  if (ctxt->attsDefault != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsDefault,xmlHashDefaultDeallocator);
    ctxt->attsDefault = (xmlHashTablePtr)0x0;
  }
  if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
    ctxt->attsSpecial = (xmlHashTablePtr)0x0;
  }
  if (ctxt->catalogs != (void *)0x0) {
    xmlCatalogFreeLocal(ctxt->catalogs);
  }
  if ((ctxt->lastError).code == 0) {
    return;
  }
  xmlResetError(&ctxt->lastError);
  return;
}

Assistant:

void
xmlCtxtReset(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input;
    xmlDictPtr dict;

    if (ctxt == NULL)
        return;

    dict = ctxt->dict;

    while ((input = inputPop(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    ctxt->inputNr = 0;
    ctxt->input = NULL;

    ctxt->spaceNr = 0;
    if (ctxt->spaceTab != NULL) {
	ctxt->spaceTab[0] = -1;
	ctxt->space = &ctxt->spaceTab[0];
    } else {
        ctxt->space = NULL;
    }


    ctxt->nodeNr = 0;
    ctxt->node = NULL;

    ctxt->nameNr = 0;
    ctxt->name = NULL;

    DICT_FREE(ctxt->version);
    ctxt->version = NULL;
    DICT_FREE(ctxt->encoding);
    ctxt->encoding = NULL;
    DICT_FREE(ctxt->directory);
    ctxt->directory = NULL;
    DICT_FREE(ctxt->extSubURI);
    ctxt->extSubURI = NULL;
    DICT_FREE(ctxt->extSubSystem);
    ctxt->extSubSystem = NULL;
    if (ctxt->myDoc != NULL)
        xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 0;
    ctxt->external = 0;
    ctxt->instate = XML_PARSER_START;
    ctxt->token = 0;

    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->disableSAX = 0;
    ctxt->valid = 1;
#if 0
    ctxt->vctxt.userData = ctxt;
    ctxt->vctxt.error = xmlParserValidityError;
    ctxt->vctxt.warning = xmlParserValidityWarning;
#endif
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = XML_ERR_OK;
    ctxt->depth = 0;
    ctxt->charset = XML_CHAR_ENCODING_UTF8;
    ctxt->catalogs = NULL;
    ctxt->nbentities = 0;
    ctxt->sizeentities = 0;
    ctxt->sizeentcopy = 0;
    ctxt->mlType = 0;
    ctxt->curly = 0;
    xmlInitNodeInfoSeq(&ctxt->node_seq);

    if (ctxt->attsDefault != NULL) {
        xmlHashFree(ctxt->attsDefault, xmlHashDefaultDeallocator);
        ctxt->attsDefault = NULL;
    }
    if (ctxt->attsSpecial != NULL) {
        xmlHashFree(ctxt->attsSpecial, NULL);
        ctxt->attsSpecial = NULL;
    }

#ifdef LIBXML_CATALOG_ENABLED
    if (ctxt->catalogs != NULL)
	xmlCatalogFreeLocal(ctxt->catalogs);
#endif
    if (ctxt->lastError.code != XML_ERR_OK)
        xmlResetError(&ctxt->lastError);
}